

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanRules(Cleaner *this,int rule_count,char **rules)

{
  State *pSVar1;
  bool bVar2;
  Rule *pRVar3;
  allocator<char> local_59;
  string local_58;
  Rule *local_38;
  Rule *rule;
  char *rule_name;
  char **ppcStack_20;
  int i;
  char **rules_local;
  Cleaner *pCStack_10;
  int rule_count_local;
  Cleaner *this_local;
  
  ppcStack_20 = rules;
  rules_local._4_4_ = rule_count;
  pCStack_10 = this;
  if (rules == (char **)0x0) {
    __assert_fail("rules",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean.cc",
                  0x107,"int Cleaner::CleanRules(int, char **)");
  }
  Reset(this);
  PrintHeader(this);
  LoadDyndeps(this);
  for (rule_name._4_4_ = 0; rule_name._4_4_ < rules_local._4_4_;
      rule_name._4_4_ = rule_name._4_4_ + 1) {
    pRVar3 = (Rule *)ppcStack_20[rule_name._4_4_];
    pSVar1 = this->state_;
    rule = pRVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)pRVar3,&local_59)
    ;
    pRVar3 = BindingEnv::LookupRule(&pSVar1->bindings_,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    local_38 = pRVar3;
    if (pRVar3 == (Rule *)0x0) {
      Error("unknown rule \'%s\'",rule);
      this->status_ = 1;
    }
    else {
      bVar2 = IsVerbose(this);
      if (bVar2) {
        printf("Rule %s\n",rule);
      }
      DoCleanRule(this,local_38);
    }
  }
  PrintFooter(this);
  return this->status_;
}

Assistant:

int Cleaner::CleanRules(int rule_count, char* rules[]) {
  assert(rules);

  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < rule_count; ++i) {
    const char* rule_name = rules[i];
    const Rule* rule = state_->bindings_.LookupRule(rule_name);
    if (rule) {
      if (IsVerbose())
        printf("Rule %s\n", rule_name);
      DoCleanRule(rule);
    } else {
      Error("unknown rule '%s'", rule_name);
      status_ = 1;
    }
  }
  PrintFooter();
  return status_;
}